

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Imputer.pb.cc
# Opt level: O0

uint8_t * __thiscall
CoreML::Specification::Imputer::_InternalSerialize
          (Imputer *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  int iVar2;
  DoubleVector *value;
  Int64Vector *value_00;
  StringToDoubleMap *value_01;
  Int64ToDoubleMap *value_02;
  uint8_t *puVar3;
  int64_t iVar4;
  char *pcVar5;
  string *psVar6;
  void *data;
  double dVar7;
  uint32_t cached_has_bits;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  Imputer *this_local;
  
  bVar1 = _internal_has_imputeddoublevalue(this);
  stream_local = (EpsCopyOutputStream *)target;
  if (bVar1) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    dVar7 = _internal_imputeddoublevalue(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteDoubleToArray(1,dVar7,puVar3);
  }
  bVar1 = _internal_has_imputedint64value(this);
  if (bVar1) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    iVar4 = _internal_imputedint64value(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteInt64ToArray(2,iVar4,puVar3);
  }
  bVar1 = _internal_has_imputedstringvalue(this);
  if (bVar1) {
    _internal_imputedstringvalue_abi_cxx11_(this);
    pcVar5 = (char *)std::__cxx11::string::data();
    _internal_imputedstringvalue_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pcVar5,iVar2,SERIALIZE,"CoreML.Specification.Imputer.imputedStringValue");
    psVar6 = _internal_imputedstringvalue_abi_cxx11_(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                             (stream,3,psVar6,(uint8_t *)stream_local);
  }
  bVar1 = _internal_has_imputeddoublearray(this);
  if (bVar1) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    value = _Internal::imputeddoublearray(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::
                   InternalWriteMessage<CoreML::Specification::DoubleVector>(4,value,puVar3,stream);
  }
  bVar1 = _internal_has_imputedint64array(this);
  if (bVar1) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    value_00 = _Internal::imputedint64array(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::
                   InternalWriteMessage<CoreML::Specification::Int64Vector>
                             (5,value_00,puVar3,stream);
  }
  bVar1 = _internal_has_imputedstringdictionary(this);
  if (bVar1) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    value_01 = _Internal::imputedstringdictionary(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::
                   InternalWriteMessage<CoreML::Specification::StringToDoubleMap>
                             (6,value_01,puVar3,stream);
  }
  bVar1 = _internal_has_imputedint64dictionary(this);
  if (bVar1) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    value_02 = _Internal::imputedint64dictionary(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::
                   InternalWriteMessage<CoreML::Specification::Int64ToDoubleMap>
                             (7,value_02,puVar3,stream);
  }
  bVar1 = _internal_has_replacedoublevalue(this);
  if (bVar1) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    dVar7 = _internal_replacedoublevalue(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteDoubleToArray(0xb,dVar7,puVar3);
  }
  bVar1 = _internal_has_replaceint64value(this);
  if (bVar1) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    iVar4 = _internal_replaceint64value(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteInt64ToArray(0xc,iVar4,puVar3);
  }
  bVar1 = _internal_has_replacestringvalue(this);
  if (bVar1) {
    _internal_replacestringvalue_abi_cxx11_(this);
    pcVar5 = (char *)std::__cxx11::string::data();
    _internal_replacestringvalue_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pcVar5,iVar2,SERIALIZE,"CoreML.Specification.Imputer.replaceStringValue");
    psVar6 = _internal_replacestringvalue_abi_cxx11_(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                             (stream,0xd,psVar6,(uint8_t *)stream_local);
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar1) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    data = (void *)std::__cxx11::string::data();
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    iVar2 = std::__cxx11::string::size();
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteRaw
                             (stream,data,iVar2,(uint8_t *)stream_local);
  }
  return (uint8_t *)stream_local;
}

Assistant:

uint8_t* Imputer::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.Imputer)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // double imputedDoubleValue = 1;
  if (_internal_has_imputeddoublevalue()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteDoubleToArray(1, this->_internal_imputeddoublevalue(), target);
  }

  // int64 imputedInt64Value = 2;
  if (_internal_has_imputedint64value()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt64ToArray(2, this->_internal_imputedint64value(), target);
  }

  // string imputedStringValue = 3;
  if (_internal_has_imputedstringvalue()) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
      this->_internal_imputedstringvalue().data(), static_cast<int>(this->_internal_imputedstringvalue().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.Imputer.imputedStringValue");
    target = stream->WriteStringMaybeAliased(
        3, this->_internal_imputedstringvalue(), target);
  }

  // .CoreML.Specification.DoubleVector imputedDoubleArray = 4;
  if (_internal_has_imputeddoublearray()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        4, _Internal::imputeddoublearray(this), target, stream);
  }

  // .CoreML.Specification.Int64Vector imputedInt64Array = 5;
  if (_internal_has_imputedint64array()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        5, _Internal::imputedint64array(this), target, stream);
  }

  // .CoreML.Specification.StringToDoubleMap imputedStringDictionary = 6;
  if (_internal_has_imputedstringdictionary()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        6, _Internal::imputedstringdictionary(this), target, stream);
  }

  // .CoreML.Specification.Int64ToDoubleMap imputedInt64Dictionary = 7;
  if (_internal_has_imputedint64dictionary()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        7, _Internal::imputedint64dictionary(this), target, stream);
  }

  // double replaceDoubleValue = 11;
  if (_internal_has_replacedoublevalue()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteDoubleToArray(11, this->_internal_replacedoublevalue(), target);
  }

  // int64 replaceInt64Value = 12;
  if (_internal_has_replaceint64value()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt64ToArray(12, this->_internal_replaceint64value(), target);
  }

  // string replaceStringValue = 13;
  if (_internal_has_replacestringvalue()) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
      this->_internal_replacestringvalue().data(), static_cast<int>(this->_internal_replacestringvalue().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.Imputer.replaceStringValue");
    target = stream->WriteStringMaybeAliased(
        13, this->_internal_replacestringvalue(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.Imputer)
  return target;
}